

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_Byte * tt_cmap14_find_variant(FT_Byte *base,FT_UInt32 variantCode)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar1 = *(uint *)base;
  uVar1 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      uVar3 = uVar2 + uVar1 >> 1;
      uVar4 = (ulong)(uVar3 * 0xb);
      uVar5 = (uint)base[uVar4 + 6] | (uint)base[uVar4 + 5] << 8 | (uint)base[uVar4 + 4] << 0x10;
      if (uVar5 <= variantCode) {
        if (variantCode <= uVar5) {
          return base + uVar4 + 7;
        }
        uVar2 = uVar3 + 1;
        uVar3 = uVar1;
      }
      uVar1 = uVar3;
    } while (uVar2 < uVar1);
  }
  return (FT_Byte *)0x0;
}

Assistant:

static FT_Byte*
  tt_cmap14_find_variant( FT_Byte    *base,
                          FT_UInt32   variantCode )
  {
    FT_UInt32  numVar = TT_PEEK_ULONG( base );
    FT_UInt32  max, min;


    min = 0;
    max = numVar;

    base += 4;

    /* binary search */
    while ( min < max )
    {
      FT_UInt32  mid    = ( min + max ) >> 1;
      FT_Byte*   p      = base + 11 * mid;
      FT_ULong   varSel = TT_NEXT_UINT24( p );


      if ( variantCode < varSel )
        max = mid;
      else if ( variantCode > varSel )
        min = mid + 1;
      else
        return p;
    }

    return NULL;
  }